

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGBA,cBGRA,bOverwrite>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  EBlend EVar7;
  FSpecialColormap *pFVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  BYTE *pBVar17;
  
  pFVar8 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004e1560_caseD_0:
    lVar12 = 0;
    if (count < 1) {
      count = 0;
    }
    pBVar17 = pin + 3;
    for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
      BVar1 = *pBVar17;
      pout[lVar12 * 4 + 2] = pBVar17[-3];
      pout[lVar12 * 4 + 1] = pBVar17[-2];
      pout[lVar12 * 4] = pBVar17[-1];
      pout[lVar12 * 4 + 3] = BVar1;
      pBVar17 = pBVar17 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004e1560_caseD_0;
    case BLEND_ICEMAP:
      lVar12 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
        BVar1 = pin[3];
        iVar14 = cRGBA::Gray(pin);
        pout[lVar12 * 4 + 2] = IcePalette[iVar14 >> 4][0];
        *(ushort *)(pout + lVar12 * 4) =
             *(ushort *)(IcePalette[iVar14 >> 4] + 1) << 8 |
             *(ushort *)(IcePalette[iVar14 >> 4] + 1) >> 8;
        pout[lVar12 * 4 + 3] = BVar1;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar12 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar17 = pin + 3;
      for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
        BVar1 = *pBVar17;
        iVar14 = inf->blendcolor[3];
        bVar2 = pBVar17[-2];
        iVar10 = inf->blendcolor[1];
        bVar3 = pBVar17[-1];
        iVar6 = inf->blendcolor[2];
        pout[lVar12 * 4 + 2] = (BYTE)((uint)pBVar17[-3] * iVar14 + inf->blendcolor[0] >> 0x10);
        pout[lVar12 * 4 + 1] = (BYTE)((uint)bVar2 * iVar14 + iVar10 >> 0x10);
        pout[lVar12 * 4] = (BYTE)((uint)bVar3 * iVar14 + iVar6 >> 0x10);
        pout[lVar12 * 4 + 3] = BVar1;
        pBVar17 = pBVar17 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar12 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar17 = pin + 3;
      for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
        BVar1 = *pBVar17;
        bVar2 = pBVar17[-2];
        iVar14 = inf->blendcolor[1];
        bVar3 = pBVar17[-1];
        iVar10 = inf->blendcolor[2];
        pout[lVar12 * 4 + 2] = (BYTE)((uint)pBVar17[-3] * inf->blendcolor[0] >> 0x10);
        pout[lVar12 * 4 + 1] = (BYTE)((uint)bVar2 * iVar14 >> 0x10);
        pout[lVar12 * 4] = (BYTE)((uint)bVar3 * iVar10 >> 0x10);
        pout[lVar12 * 4 + 3] = BVar1;
        pBVar17 = pBVar17 + step;
      }
      break;
    default:
      EVar7 = inf->blend;
      lVar12 = (long)EVar7;
      if (lVar12 < 0x21) {
        if (BLEND_ICEMAP < EVar7) {
          iVar14 = 0x20 - EVar7;
          uVar16 = 0;
          uVar13 = (ulong)(uint)count;
          if (count < 1) {
            uVar13 = uVar16;
          }
          for (; (int)uVar13 != (int)uVar16; uVar16 = uVar16 + 1) {
            bVar2 = pin[3];
            iVar10 = cRGBA::Gray(pin);
            iVar10 = iVar10 * (EVar7 + BLEND_MODULATE);
            bVar3 = pin[1];
            bVar4 = pin[2];
            pout[uVar16 * 4 + 2] = (BYTE)((int)((uint)*pin * iVar14 + iVar10) / 0x1f);
            pout[uVar16 * 4 + 1] = (BYTE)((int)((uint)bVar3 * iVar14 + iVar10) / 0x1f);
            pout[uVar16 * 4] = (BYTE)((int)((uint)bVar4 * iVar14 + iVar10) / 0x1f);
            pout[uVar16 * 4 + 3] = bVar2;
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar15 = 0; count != (int)lVar15; lVar15 = lVar15 + 1) {
          BVar1 = pin[3];
          uVar9 = cRGBA::Gray(pin);
          uVar11 = 0xff;
          if (uVar9 < 0xff) {
            uVar11 = uVar9;
          }
          if ((int)uVar9 < 1) {
            uVar11 = 0;
          }
          uVar5 = *(undefined2 *)((long)pFVar8 + (ulong)uVar11 * 4 + lVar12 * 0x518 + -0xa700);
          pout[lVar15 * 4 + 2] =
               *(BYTE *)((long)pFVar8 + (ulong)uVar11 * 4 + lVar12 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar15 * 4) = uVar5;
          pout[lVar15 * 4 + 3] = BVar1;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}